

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_codec.c
# Opt level: O3

aom_codec_err_t aom_codec_destroy(aom_codec_ctx_t *ctx)

{
  aom_codec_err_t aVar1;
  
  if (ctx != (aom_codec_ctx_t *)0x0) {
    if ((ctx->iface == (aom_codec_iface_t *)0x0) ||
       ((aom_codec_alg_priv_t_conflict *)ctx->priv == (aom_codec_alg_priv_t_conflict *)0x0)) {
      ctx->err = AOM_CODEC_ERROR;
      aVar1 = AOM_CODEC_ERROR;
    }
    else {
      (*ctx->iface->destroy)((aom_codec_alg_priv_t_conflict *)ctx->priv);
      ctx->priv = (aom_codec_priv_t *)0x0;
      ctx->name = (char *)0x0;
      ctx->iface = (aom_codec_iface_t *)0x0;
      ctx->err = AOM_CODEC_OK;
      aVar1 = AOM_CODEC_OK;
    }
    return aVar1;
  }
  return AOM_CODEC_INVALID_PARAM;
}

Assistant:

aom_codec_err_t aom_codec_destroy(aom_codec_ctx_t *ctx) {
  if (!ctx) {
    return AOM_CODEC_INVALID_PARAM;
  }
  if (!ctx->iface || !ctx->priv) {
    ctx->err = AOM_CODEC_ERROR;
    return AOM_CODEC_ERROR;
  }
  ctx->iface->destroy((aom_codec_alg_priv_t *)ctx->priv);
  ctx->iface = NULL;
  ctx->name = NULL;
  ctx->priv = NULL;
  ctx->err = AOM_CODEC_OK;
  return AOM_CODEC_OK;
}